

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O1

void cf_hc_adjust_pollset(Curl_cfilter *cf,Curl_easy *data,easy_pollset *ps)

{
  int *piVar1;
  curl_trc_feat *pcVar2;
  int *piVar3;
  ulong uVar4;
  
  if ((cf->field_0x24 & 1) == 0) {
    piVar1 = (int *)cf->ctx;
    if (*(long *)(piVar1 + 0x26) != 0) {
      uVar4 = 0;
      piVar3 = piVar1;
      do {
        if ((*(Curl_cfilter **)(piVar3 + 0xc) != (Curl_cfilter *)0x0) && (piVar3[0xe] == 0)) {
          Curl_conn_cf_adjust_pollset(*(Curl_cfilter **)(piVar3 + 0xc),data,ps);
        }
        uVar4 = uVar4 + 1;
        piVar3 = piVar3 + 0xe;
      } while (uVar4 < *(ulong *)(piVar1 + 0x26));
    }
    if ((data != (Curl_easy *)0x0) && (((data->set).field_0x897 & 0x40) != 0)) {
      pcVar2 = (data->state).feat;
      if (pcVar2 == (curl_trc_feat *)0x0) {
        if (cf == (Curl_cfilter *)0x0) {
          return;
        }
      }
      else {
        if (cf == (Curl_cfilter *)0x0) {
          return;
        }
        if (pcVar2->log_level < 1) {
          return;
        }
      }
      if (0 < cf->cft->log_level) {
        Curl_trc_cf_infof(data,cf,"adjust_pollset -> %d socks",(ulong)ps->num);
        return;
      }
    }
  }
  return;
}

Assistant:

static void cf_hc_adjust_pollset(struct Curl_cfilter *cf,
                                  struct Curl_easy *data,
                                  struct easy_pollset *ps)
{
  if(!cf->connected) {
    struct cf_hc_ctx *ctx = cf->ctx;
    size_t i;

    for(i = 0; i < ctx->baller_count; i++) {
      struct cf_hc_baller *b = &ctx->ballers[i];
      if(!cf_hc_baller_is_active(b))
        continue;
      Curl_conn_cf_adjust_pollset(b->cf, data, ps);
    }
    CURL_TRC_CF(data, cf, "adjust_pollset -> %d socks", ps->num);
  }
}